

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O3

void test_divceil<std::vector<int,std::allocator<int>>,signed_char>
               (vector<int,_std::allocator<int>_> *values,char divisor,size_t attempt_count)

{
  Integer<int> *pIVar1;
  enable_if_t<std::is_signed<int>::value_&&_(std::is_signed<signed_char>::value____(std::is_unsigned<signed_char>::value_&&_std::is_signed<std::common_type_t<int,_signed_char>_>::value)),_int>
  eVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  ostream *poVar6;
  Integer<int> *pIVar7;
  int iVar8;
  size_t sVar9;
  int iVar10;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  iVar10 = 0;
  if (attempt_count != 0) {
    sVar9 = 0;
    do {
      pIVar7 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      iVar8 = 0;
      if (pIVar7 != pIVar1) {
        iVar8 = 0;
        do {
          eVar2 = burst::divceil<int,signed_char>(*pIVar7,divisor);
          iVar8 = iVar8 + eVar2;
          pIVar7 = pIVar7 + 1;
        } while (pIVar7 != pIVar1);
      }
      iVar10 = iVar10 + iVar8;
      sVar9 = sVar9 + 1;
    } while (sVar9 != attempt_count);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  plVar5 = (long *)std::ostream::operator<<(&std::clog,iVar10);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_1f098,0xc)
  ;
  poVar6 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}